

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O3

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::TryCastTableFilter
          (duckdb *this,TableFilter *global_filter,MultiFileIndexMapping *mapping,
          LogicalType *target_type)

{
  TableFilterType value;
  ExpressionType comparison_type_p;
  pointer puVar1;
  pointer pcVar2;
  Value **ppVVar3;
  Value **ppVVar4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> uVar8;
  ConjunctionAndFilter *pCVar9;
  __uniq_ptr_impl<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>_>
  this_00;
  pointer pCVar10;
  DynamicFilter *pDVar11;
  DynamicFilterData *pDVar12;
  pthread_mutex_t *__mutex;
  type global_filter_00;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> uVar13;
  ConstantFilter *pCVar14;
  ConstantFilter *this_01;
  ConjunctionOrFilter *pCVar15;
  _Tuple_impl<0UL,_duckdb::ConjunctionAndFilter_*,_std::default_delete<duckdb::ConjunctionAndFilter>_>
  this_02;
  pointer pCVar16;
  OptionalFilter *pOVar17;
  type pTVar18;
  StructFilter *pSVar19;
  iterator iVar20;
  type mapping_00;
  child_list_t<LogicalType> *this_03;
  const_reference pvVar21;
  InFilter *pIVar22;
  reference source;
  TableFilter *extraout_RAX;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_> extraout_RAX_00;
  tuple<duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_> extraout_RAX_01;
  _Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_> _Var23;
  NotImplementedException *this_04;
  _Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false> _Var24;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *it;
  pointer puVar25;
  Value *this_05;
  shared_ptr<duckdb::DynamicFilterData,_true> *this_06;
  Value new_constant;
  Value *local_e8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_e0;
  Value local_d8;
  Value local_98;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  value = global_filter->filter_type;
  switch(value) {
  case CONSTANT_COMPARISON:
    pCVar14 = TableFilter::Cast<duckdb::ConstantFilter>(global_filter);
    Value::Value(&local_d8,&pCVar14->constant);
    bVar6 = StatisticsPropagator::CanPropagateCast(&(pCVar14->constant).type_,target_type);
    if ((bVar6) && (bVar6 = Value::DefaultTryCastAs(&local_d8,target_type,false), bVar6)) {
      this_01 = (ConstantFilter *)operator_new(0x50);
      comparison_type_p = (pCVar14->super_TableFilter).field_0x9;
      Value::Value(&local_98,&local_d8);
      ConstantFilter::ConstantFilter(this_01,comparison_type_p,&local_98);
      Value::~Value(&local_98);
    }
    else {
      this_01 = (ConstantFilter *)0x0;
    }
    *(ConstantFilter **)this = this_01;
    Value::~Value(&local_d8);
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)
           extraout_RAX;
  case IS_NULL:
  case IS_NOT_NULL:
    uVar8.super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
    super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl._0_4_ =
         (*global_filter->_vptr_TableFilter[4])(this);
    uVar8.super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
    super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl._4_4_ = extraout_var;
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)
           uVar8.super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
           super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
  case CONJUNCTION_OR:
    pCVar15 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(global_filter);
    this_02.super__Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false>)operator_new(0x28);
    ConjunctionOrFilter::ConjunctionOrFilter
              ((ConjunctionOrFilter *)
               this_02.super__Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false>._M_head_impl);
    puVar25 = (pCVar15->super_ConjunctionFilter).child_filters.
              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pCVar15->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_98.type_._0_8_ =
         this_02.super__Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false>._M_head_impl;
    if (puVar25 != puVar1) {
      do {
        pTVar18 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(puVar25);
        TryCastTableFilter((duckdb *)&local_d8,pTVar18,mapping,target_type);
        if ((Value *)local_d8.type_._0_8_ == (Value *)0x0) goto LAB_00aba647;
        pCVar16 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                  ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                *)&local_98);
        ::std::
        vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                    *)&(pCVar16->super_ConjunctionFilter).child_filters,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_d8);
        if ((Value *)local_d8.type_._0_8_ != (Value *)0x0) {
          (*(((ConjunctionFilter *)local_d8.type_._0_8_)->super_TableFilter)._vptr_TableFilter[1])()
          ;
        }
        puVar25 = puVar25 + 1;
      } while (puVar25 != puVar1);
    }
    goto LAB_00aba400;
  case CONJUNCTION_AND:
    pCVar9 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(global_filter);
    this_00._M_t.
    super__Tuple_impl<0UL,_duckdb::ConjunctionAndFilter_*,_std::default_delete<duckdb::ConjunctionAndFilter>_>
    .super__Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false>._M_head_impl =
         (tuple<duckdb::ConjunctionAndFilter_*,_std::default_delete<duckdb::ConjunctionAndFilter>_>)
         operator_new(0x28);
    ConjunctionAndFilter::ConjunctionAndFilter
              ((ConjunctionAndFilter *)
               this_00._M_t.
               super__Tuple_impl<0UL,_duckdb::ConjunctionAndFilter_*,_std::default_delete<duckdb::ConjunctionAndFilter>_>
               .super__Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false>._M_head_impl);
    puVar25 = (pCVar9->super_ConjunctionFilter).child_filters.
              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pCVar9->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_98.type_._0_8_ =
         this_00._M_t.
         super__Tuple_impl<0UL,_duckdb::ConjunctionAndFilter_*,_std::default_delete<duckdb::ConjunctionAndFilter>_>
         .super__Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false>._M_head_impl;
    if (puVar25 != puVar1) {
      do {
        pTVar18 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(puVar25);
        TryCastTableFilter((duckdb *)&local_d8,pTVar18,mapping,target_type);
        if ((Value *)local_d8.type_._0_8_ == (Value *)0x0) goto LAB_00aba647;
        pCVar10 = unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
                  ::operator->((unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
                                *)&local_98);
        ::std::
        vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                    *)&(pCVar10->super_ConjunctionFilter).child_filters,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_d8);
        if ((Value *)local_d8.type_._0_8_ != (Value *)0x0) {
          (*(((ConjunctionFilter *)local_d8.type_._0_8_)->super_TableFilter)._vptr_TableFilter[1])()
          ;
        }
        puVar25 = puVar25 + 1;
      } while (puVar25 != puVar1);
    }
LAB_00aba400:
    *(undefined8 *)this = local_98.type_._0_8_;
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this;
  case STRUCT_EXTRACT:
    pSVar19 = TableFilter::Cast<duckdb::StructFilter>(global_filter);
    iVar20 = ::std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(mapping->child_mapping)._M_h,&pSVar19->child_idx);
    if (iVar20.
        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      mapping_00 = unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                   ::operator*((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                                *)((long)iVar20.
                                         super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_false>
                                         ._M_cur + 0x10));
      this_03 = StructType::GetChildTypes_abi_cxx11_(target_type);
      pvVar21 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                ::operator[](this_03,mapping_00->index);
      pTVar18 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                operator*(&pSVar19->child_filter);
      TryCastTableFilter((duckdb *)&local_e8,pTVar18,mapping_00,&pvVar21->second);
      if (local_e8 != (Value *)0x0) {
        pvVar21 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  ::operator[](this_03,mapping_00->index);
        ppVVar3 = (Value **)
                  &local_d8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        pcVar2 = (pvVar21->first)._M_dataplus._M_p;
        local_d8.type_._0_8_ = ppVVar3;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar2,pcVar2 + (pvVar21->first)._M_string_length);
        pSVar19 = (StructFilter *)operator_new(0x40);
        ppVVar4 = (Value **)
                  &local_98.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        if ((Value **)local_d8.type_._0_8_ == ppVVar3) {
          local_98.is_null = local_d8.is_null;
          local_98._25_7_ = local_d8._25_7_;
          local_98.type_._0_8_ = ppVVar4;
        }
        else {
          local_98.type_.id_ = local_d8.type_.id_;
          local_98.type_.physical_type_ = local_d8.type_.physical_type_;
          local_98.type_._2_6_ = local_d8.type_._2_6_;
        }
        local_98.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_d8.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_d8.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             & 0xffffffffffffff00;
        local_e0._M_head_impl = (TableFilter *)local_e8;
        local_e8 = (Value *)0x0;
        local_d8.type_._0_8_ = ppVVar3;
        StructFilter::StructFilter
                  (pSVar19,mapping_00->index,(string *)&local_98,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_e0);
        if ((Value *)local_e0._M_head_impl != (Value *)0x0) {
          (*(((ConjunctionFilter *)&(local_e0._M_head_impl)->_vptr_TableFilter)->super_TableFilter).
            _vptr_TableFilter[1])();
        }
        local_e0._M_head_impl = (TableFilter *)0x0;
        if ((Value **)local_98.type_._0_8_ != ppVVar4) {
          operator_delete((void *)local_98.type_._0_8_);
        }
        *(StructFilter **)this = pSVar19;
        _Var24._M_head_impl = (ConjunctionAndFilter *)local_e8;
        if ((Value **)local_d8.type_._0_8_ != ppVVar3) {
          operator_delete((void *)local_d8.type_._0_8_);
          this = (duckdb *)
                 extraout_RAX_01.
                 super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                 .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
          _Var24._M_head_impl = (ConjunctionAndFilter *)local_e8;
        }
        goto LAB_00aba6fd;
      }
    }
    break;
  case OPTIONAL_FILTER:
    pOVar17 = TableFilter::Cast<duckdb::OptionalFilter>(global_filter);
    pTVar18 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
              operator*(&pOVar17->child_filter);
    TryCastTableFilter((duckdb *)&local_d8,pTVar18,mapping,target_type);
    if ((ConjunctionAndFilter *)local_d8.type_._0_8_ != (ConjunctionAndFilter *)0x0) {
      pOVar17 = (OptionalFilter *)operator_new(0x18);
      local_98.type_.id_ = local_d8.type_.id_;
      local_98.type_.physical_type_ = local_d8.type_.physical_type_;
      local_98.type_._2_6_ = local_d8.type_._2_6_;
      local_d8.type_._0_8_ = (Value *)0x0;
      OptionalFilter::OptionalFilter
                (pOVar17,(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&local_98);
      if ((_Tuple_impl<0UL,_duckdb::ConjunctionAndFilter_*,_std::default_delete<duckdb::ConjunctionAndFilter>_>
           )local_98.type_._0_8_ != (ConjunctionAndFilter *)0x0) {
        (**(code **)(*(long *)local_98.type_._0_8_ + 8))();
      }
      *(OptionalFilter **)this = pOVar17;
      _Var24._M_head_impl = (ConjunctionAndFilter *)local_d8.type_._0_8_;
      goto LAB_00aba6fd;
    }
    break;
  case IN_FILTER:
    pIVar22 = TableFilter::Cast<duckdb::InFilter>(global_filter);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8,
               &(pIVar22->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    if ((element_type *)local_d8.type_._0_8_ !=
        local_d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      source = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)&local_d8,0);
      bVar6 = StatisticsPropagator::CanPropagateCast(&source->type_,target_type);
      peVar5 = local_d8.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (!bVar6) {
        pIVar22 = (InFilter *)0x0;
        goto LAB_00aba660;
      }
      if ((element_type *)local_d8.type_._0_8_ !=
          local_d8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
        pIVar22 = (InFilter *)0x0;
        this_05 = (Value *)local_d8.type_._0_8_;
        do {
          bVar6 = Value::DefaultTryCastAs(this_05,target_type,false);
          if (!bVar6) goto LAB_00aba660;
          this_05 = this_05 + 1;
        } while (this_05 != (Value *)peVar5);
      }
    }
    pIVar22 = (InFilter *)operator_new(0x28);
    local_98.type_.id_ = local_d8.type_.id_;
    local_98.type_.physical_type_ = local_d8.type_.physical_type_;
    local_98.type_._2_6_ = local_d8.type_._2_6_;
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_d8.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_d8.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_d8.type_._0_8_ = (Value *)0x0;
    local_d8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    InFilter::InFilter(pIVar22,(vector<duckdb::Value,_true> *)&local_98);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_98);
LAB_00aba660:
    *(InFilter **)this = pIVar22;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8);
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
           extraout_RAX_00._M_t.
           super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
           super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
  case DYNAMIC_FILTER:
    pDVar11 = TableFilter::Cast<duckdb::DynamicFilter>(global_filter);
    if ((pDVar11->filter_data).internal.
        super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_06 = &pDVar11->filter_data;
      pDVar12 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_06);
      if ((pDVar12->initialized != false) &&
         (pDVar12 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_06),
         (pDVar12->filter).
         super_unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ConstantFilter_*,_std::default_delete<duckdb::ConstantFilter>_>
         .super__Head_base<0UL,_duckdb::ConstantFilter_*,_false>._M_head_impl !=
         (ConstantFilter *)0x0)) {
        __mutex = (pthread_mutex_t *)
                  shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_06);
        iVar7 = pthread_mutex_lock(__mutex);
        if (iVar7 == 0) {
          pDVar12 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_06);
          global_filter_00 =
               unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>,_true>
               ::operator*(&pDVar12->filter);
          TryCastTableFilter(this,&global_filter_00->super_TableFilter,mapping,target_type);
          uVar13.super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
          _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
          super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl._0_4_ =
               pthread_mutex_unlock(__mutex);
          uVar13.super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
          _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
          super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl._4_4_ = extraout_var_00;
          return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)
                 uVar13.
                 super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                 .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
        }
        ::std::__throw_system_error(iVar7);
      }
    }
    break;
  case EXPRESSION_FILTER:
    break;
  default:
    this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "Can\'t convert TableFilterType (%s) from global to local indexes","");
    EnumUtil::ToString<duckdb::TableFilterType>((string *)&stack0xffffffffffffffb0,value);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_04,(string *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffb0);
    __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)
         (TableFilter *)this;
LAB_00aba647:
  *(undefined8 *)this = 0;
  _Var24._M_head_impl = (ConjunctionAndFilter *)local_98.type_._0_8_;
LAB_00aba6fd:
  if ((_Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false>)_Var24._M_head_impl ==
      (_Head_base<0UL,_duckdb::ConjunctionAndFilter_*,_false>)0x0) {
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this;
  }
  _Var23.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl._0_4_ =
       (*((_Var24._M_head_impl)->super_ConjunctionFilter).super_TableFilter._vptr_TableFilter[1])();
  _Var23.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl._4_4_ = extraout_var_01;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         _Var23.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<TableFilter> TryCastTableFilter(const TableFilter &global_filter, MultiFileIndexMapping &mapping,
                                                  const LogicalType &target_type) {
	auto type = global_filter.filter_type;

	switch (type) {
	case TableFilterType::CONJUNCTION_OR: {
		auto &or_filter = global_filter.Cast<ConjunctionOrFilter>();
		auto res = make_uniq<ConjunctionOrFilter>();
		for (auto &it : or_filter.child_filters) {
			auto child_filter = TryCastTableFilter(*it, mapping, target_type);
			if (!child_filter) {
				return nullptr;
			}
			res->child_filters.push_back(std::move(child_filter));
		}
		return std::move(res);
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &and_filter = global_filter.Cast<ConjunctionAndFilter>();
		auto res = make_uniq<ConjunctionAndFilter>();
		for (auto &it : and_filter.child_filters) {
			auto child_filter = TryCastTableFilter(*it, mapping, target_type);
			if (!child_filter) {
				return nullptr;
			}
			res->child_filters.push_back(std::move(child_filter));
		}
		return std::move(res);
	}
	case TableFilterType::STRUCT_EXTRACT: {
		auto &struct_filter = global_filter.Cast<StructFilter>();
		auto &child_filter = struct_filter.child_filter;

		// find the corresponding local entry
		auto entry = mapping.child_mapping.find(struct_filter.child_idx);
		if (entry == mapping.child_mapping.end()) {
			// this is constant for this file - abort
			// FIXME: should be handled before
			return nullptr;
		}
		auto &struct_mapping = *entry->second;
		auto &struct_type = StructType::GetChildTypes(target_type);
		auto &child_type = struct_type[struct_mapping.index].second;
		auto new_child_filter = TryCastTableFilter(*child_filter, struct_mapping, child_type);
		if (!new_child_filter) {
			return nullptr;
		}
		auto child_name = struct_type[struct_mapping.index].first;
		return make_uniq<StructFilter>(struct_mapping.index, std::move(child_name), std::move(new_child_filter));
	}
	case TableFilterType::OPTIONAL_FILTER: {
		auto &optional_filter = global_filter.Cast<OptionalFilter>();
		auto child_result = TryCastTableFilter(*optional_filter.child_filter, mapping, target_type);
		if (!child_result) {
			return nullptr;
		}
		return make_uniq<OptionalFilter>(std::move(child_result));
	}
	case TableFilterType::DYNAMIC_FILTER: {
		// we can't transfer dynamic filters over casts directly
		// BUT we can copy the current state of the filter and push that
		// FIXME: we could solve this in a different manner as well by pushing the dynamic filter directly
		auto &dynamic_filter = global_filter.Cast<DynamicFilter>();
		if (!dynamic_filter.filter_data) {
			return nullptr;
		}
		if (!dynamic_filter.filter_data->initialized) {
			return nullptr;
		}
		if (!dynamic_filter.filter_data->filter) {
			return nullptr;
		}
		lock_guard<mutex> lock(dynamic_filter.filter_data->lock);
		return TryCastTableFilter(*dynamic_filter.filter_data->filter, mapping, target_type);
	}
	case TableFilterType::IS_NULL:
	case TableFilterType::IS_NOT_NULL:
		// these filters can just be copied as they don't depend on type
		return global_filter.Copy();
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = global_filter.Cast<ConstantFilter>();
		auto new_constant = constant_filter.constant;
		if (!StatisticsPropagator::CanPropagateCast(constant_filter.constant.type(), target_type)) {
			// type cannot be converted - abort
			return nullptr;
		}
		if (!new_constant.DefaultTryCastAs(target_type)) {
			return nullptr;
		}
		return make_uniq<ConstantFilter>(constant_filter.comparison_type, std::move(new_constant));
	}
	case TableFilterType::IN_FILTER: {
		auto &in_filter = global_filter.Cast<InFilter>();
		auto in_list = in_filter.values;
		if (!in_list.empty() && !StatisticsPropagator::CanPropagateCast(in_list[0].type(), target_type)) {
			// type cannot be converted - abort
			return nullptr;
		}
		for (auto &val : in_list) {
			if (!val.DefaultTryCastAs(target_type)) {
				return nullptr;
			}
		}
		return make_uniq<InFilter>(std::move(in_list));
	}
	case TableFilterType::EXPRESSION_FILTER:
		// unsupported
		return nullptr;
	default:
		throw NotImplementedException("Can't convert TableFilterType (%s) from global to local indexes",
		                              EnumUtil::ToString(type));
	}
}